

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

void __thiscall QByteArray::clear(QByteArray *this)

{
  QArrayDataPointer<char> *in_stack_00000008;
  
  QArrayDataPointer<char>::clear(in_stack_00000008);
  return;
}

Assistant:

void QByteArray::clear()
{
    d.clear();
}